

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

Value * __thiscall
cmFileAPI::BuildCodeModel(Value *__return_storage_ptr__,cmFileAPI *this,Object *object)

{
  Value *pVVar1;
  Value local_40;
  
  cmFileAPICodemodelDump(__return_storage_ptr__,this,object->Version);
  Json::Value::Value(&local_40,ObjectKindName::objectKindNames[(int)object->Kind]);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"kind");
  Json::Value::operator=(pVVar1,&local_40);
  Json::Value::~Value(&local_40);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"version");
  if (object->Version == 2) {
    BuildVersion(&local_40,2,4);
    Json::Value::operator=(pVVar1,&local_40);
    Json::Value::~Value(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildCodeModel(Object const& object)
{
  Json::Value codemodel = cmFileAPICodemodelDump(*this, object.Version);
  codemodel["kind"] = this->ObjectKindName(object.Kind);

  Json::Value& version = codemodel["version"];
  if (object.Version == 2) {
    version = BuildVersion(2, CodeModelV2Minor);
  } else {
    return codemodel; // should be unreachable
  }

  return codemodel;
}